

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O1

void prvTidyFixXhtmlNamespace(TidyDocImpl *doc,Bool wantXmlns)

{
  int iVar1;
  Node *node;
  AttVal *attr;
  
  node = prvTidyFindHTML(doc);
  if (node != (Node *)0x0) {
    attr = prvTidyAttrGetById(node,TidyAttr_XMLNS);
    if (wantXmlns != no) {
      if (((attr != (AttVal *)0x0) && (attr->value != (ctmbstr)0x0)) &&
         (iVar1 = prvTidytmbstrcasecmp(attr->value,"http://www.w3.org/1999/xhtml"), iVar1 == 0)) {
        return;
      }
      prvTidyRepairAttrValue(doc,node,"xmlns","http://www.w3.org/1999/xhtml");
      return;
    }
    if (attr != (AttVal *)0x0) {
      prvTidyRemoveAttribute(doc,node,attr);
      return;
    }
  }
  return;
}

Assistant:

void TY_(FixXhtmlNamespace)(TidyDocImpl* doc, Bool wantXmlns)
{
    Node* html = TY_(FindHTML)(doc);
    AttVal* xmlns;

    if (!html)
        return;

    xmlns = TY_(AttrGetById)(html, TidyAttr_XMLNS);

    if (wantXmlns)
    {
        if (!AttrValueIs(xmlns, XHTML_NAMESPACE))
            TY_(RepairAttrValue)(doc, html, "xmlns", XHTML_NAMESPACE);
    }
    else if (xmlns)
    {
        TY_(RemoveAttribute)(doc, html, xmlns);
    }
}